

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

char * get_header_name(c2m_ctx_t c2m_ctx,VARR_token_t *buffer,pos_t err_pos,char **content)

{
  size_t sVar1;
  token_t ptVar2;
  undefined8 local_40;
  size_t i;
  char **content_local;
  VARR_token_t *buffer_local;
  c2m_ctx_t c2m_ctx_local;
  pos_t err_pos_local;
  
  *content = (char *)0x0;
  transform_to_header(c2m_ctx,buffer);
  local_40 = 0;
  sVar1 = VARR_token_tlength(buffer);
  if (sVar1 != 0) {
    ptVar2 = VARR_token_tget(buffer,0);
    if ((short)*(undefined4 *)ptVar2 == 0x20) {
      local_40 = 1;
    }
  }
  sVar1 = VARR_token_tlength(buffer);
  if (local_40 == sVar1 - 1) {
    ptVar2 = VARR_token_tget(buffer,local_40);
    if ((short)*(undefined4 *)ptVar2 != 0x102) {
      ptVar2 = VARR_token_tget(buffer,local_40);
      if ((short)*(undefined4 *)ptVar2 != 0x13e) goto LAB_0019c2ca;
    }
    ptVar2 = VARR_token_tget(buffer,local_40);
    err_pos_local._8_8_ = get_include_fname(c2m_ctx,ptVar2,content);
  }
  else {
LAB_0019c2ca:
    error(c2m_ctx,0x1d792c,err_pos.fname,err_pos._8_8_);
    err_pos_local.lno = 0;
    err_pos_local.ln_pos = 0;
  }
  return (char *)err_pos_local._8_8_;
}

Assistant:

static const char *get_header_name (c2m_ctx_t c2m_ctx, VARR (token_t) * buffer, pos_t err_pos,
                                    const char **content) {
  size_t i;

  *content = NULL;
  transform_to_header (c2m_ctx, buffer);
  i = 0;
  if (VARR_LENGTH (token_t, buffer) != 0 && VARR_GET (token_t, buffer, 0)->code == ' ') i++;
  if (i != VARR_LENGTH (token_t, buffer) - 1
      || (VARR_GET (token_t, buffer, i)->code != T_STR
          && VARR_GET (token_t, buffer, i)->code != T_HEADER)) {
    error (c2m_ctx, err_pos, "wrong #include");
    return NULL;
  }
  return get_include_fname (c2m_ctx, VARR_GET (token_t, buffer, i), content);
}